

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventpoint_p.h
# Opt level: O0

void __thiscall
QEventPointPrivate::QEventPointPrivate
          (QEventPointPrivate *this,int pointId,State state,QPointF *scenePosition,
          QPointF *globalPosition)

{
  undefined8 *in_RCX;
  char in_DL;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 *in_R8;
  
  QSharedData::QSharedData((QSharedData *)0x345b70);
  *(undefined8 *)(in_RDI + 8) = 0;
  QPointer<QWindow>::QPointer((QPointer<QWindow> *)0x345b86);
  QPointer<QObject>::QPointer((QPointer<QObject> *)0x345b94);
  QPointF::QPointF((QPointF *)(in_RDI + 0x30));
  *(undefined8 *)(in_RDI + 0x40) = *in_RCX;
  *(undefined8 *)(in_RDI + 0x48) = in_RCX[1];
  *(undefined8 *)(in_RDI + 0x50) = *in_R8;
  *(undefined8 *)(in_RDI + 0x58) = in_R8[1];
  QPointF::QPointF((QPointF *)(in_RDI + 0x60));
  QPointF::QPointF((QPointF *)(in_RDI + 0x70));
  QPointF::QPointF((QPointF *)(in_RDI + 0x80));
  *(undefined8 *)(in_RDI + 0x90) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  QSizeF::QSizeF((QSizeF *)(in_RDI + 0xa0),0.0,0.0);
  QVector2D::QVector2D((QVector2D *)(in_RDI + 0xb0));
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 0xd8) = in_ESI;
  *(char *)(in_RDI + 0xdc) = in_DL;
  *(undefined1 *)(in_RDI + 0xdd) = 0;
  if (in_DL == '\b') {
    *(undefined8 *)(in_RDI + 0x90) = 0;
  }
  return;
}

Assistant:

QEventPointPrivate(int pointId, QEventPoint::State state, const QPointF &scenePosition, const QPointF &globalPosition)
        : scenePos(scenePosition), globalPos(globalPosition), pointId(pointId), state(state)
    {
        if (state == QEventPoint::State::Released)
            pressure = 0;
    }